

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  const_iterator End;
  bool bVar1;
  Sym p;
  const_iterator Begin;
  const_reference this_00;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_RCX;
  int in_EDX;
  CycleBreaking<covenant::Sym> *in_RDI;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_1;
  
  bVar1 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::empty
                    ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (bVar1) {
    local_1 = true;
  }
  else {
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::begin(in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
    ::operator+((__normal_iterator<const_covenant::Sym_*,_std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>
                 *)in_RDI,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    Begin = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::end
                      (in_stack_ffffffffffffff98);
    End._M_current._4_4_ = in_stack_ffffffffffffffb4;
    End._M_current._0_4_ = in_stack_ffffffffffffffb0;
    bVar1 = allTerminal(in_RDI,Begin,End,
                        (set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar1) {
      this_00 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](in_RCX,0);
      p = Sym::mkVar(in_EDX);
      bVar1 = Sym::operator==(this_00,p);
      local_1 = true;
      if (!bVar1) {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](in_RCX,0);
        local_1 = isTerminal((CycleBreaking<covenant::Sym> *)CONCAT44(p.x,in_stack_ffffffffffffffb0)
                             ,(Sym *)in_RDI,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)
                             CONCAT17(local_1,in_stack_ffffffffffffffa0));
      }
    }
    else {
      local_1 = false;
    }
  }
  return (bool)local_1;
}

Assistant:

bool isLLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
    if (allTerminal(rhs.begin()+1, rhs.end(), scc))
      return ((rhs[0] == EdgeSym::mkVar(lhs)) || isTerminal(rhs[0],scc));
    else
      return false;
  }